

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandCof(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Ntk_t *pNtk_00;
  int Const;
  int c;
  Abc_Obj_t *pNode;
  Abc_Ntk_t *pNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pNtk_00 = Abc_FrameReadNtk(pAbc);
  Extra_UtilGetoptReset();
  iVar1 = Extra_UtilGetopt(argc,argv,"h");
  if (iVar1 == -1) {
    if (pNtk_00 == (Abc_Ntk_t *)0x0) {
      Abc_Print(-1,"Empty network.\n");
      return 1;
    }
    iVar1 = Abc_NtkIsLogic(pNtk_00);
    if (iVar1 == 0) {
      Abc_Print(-1,"Currently can only be applied to a logic network.\n");
      return 1;
    }
    if (argc == globalUtilOptind + 2) {
      _Const = Abc_NtkFindCi(pNtk_00,argv[globalUtilOptind]);
      if (_Const == (Abc_Obj_t *)0x0) {
        _Const = Abc_NtkFindNode(pNtk_00,argv[globalUtilOptind]);
      }
      if (_Const == (Abc_Obj_t *)0x0) {
        Abc_Print(-1,"Cannot find node \"%s\".\n",argv[globalUtilOptind]);
        return 1;
      }
      iVar1 = atoi(argv[globalUtilOptind + 1]);
      if ((iVar1 != 0) && (iVar1 != 1)) {
        Abc_Print(-1,"Constant should be 0 or 1.\n",argv[globalUtilOptind + 1]);
        return 1;
      }
      Abc_ObjReplaceByConstant(_Const,iVar1);
      return 0;
    }
    Abc_Print(-1,"Wrong number of auguments.\n");
  }
  Abc_Print(-2,"usage: cof [-h] <node> <const>\n");
  Abc_Print(-2,"\t          replaces one node in a logic network by constant 0 or 1\n");
  Abc_Print(-2,"\t-h      : print the command usage\n");
  Abc_Print(-2,"\t<node>  : the node to replace\n");
  Abc_Print(-2,"\t<const> : the constant to replace the node with\n");
  Abc_Print(-2,"\tname    : the node name\n");
  return 1;
}

Assistant:

int Abc_CommandCof( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk;
    Abc_Obj_t * pNode;
    int c, Const;

    pNtk = Abc_FrameReadNtk(pAbc);
    // set defaults
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "h" ) ) != EOF )
    {
        switch ( c )
        {
       case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }

    if ( !Abc_NtkIsLogic(pNtk) )
    {
        Abc_Print( -1, "Currently can only be applied to a logic network.\n" );
        return 1;
    }

    if ( argc != globalUtilOptind + 2 )
    {
        Abc_Print( -1, "Wrong number of auguments.\n" );
        goto usage;
    }
    pNode = Abc_NtkFindCi( pNtk, argv[globalUtilOptind] );
    if ( pNode == NULL )
        pNode = Abc_NtkFindNode( pNtk, argv[globalUtilOptind] );
    if ( pNode == NULL )
    {
        Abc_Print( -1, "Cannot find node \"%s\".\n", argv[globalUtilOptind] );
        return 1;
    }
    Const = atoi( argv[globalUtilOptind+1] );
    if ( Const != 0 && Const != 1 )
    {
        Abc_Print( -1, "Constant should be 0 or 1.\n", argv[globalUtilOptind+1] );
        return 1;
    }
    Abc_ObjReplaceByConstant( pNode, Const );
    return 0;

usage:
    Abc_Print( -2, "usage: cof [-h] <node> <const>\n" );
    Abc_Print( -2, "\t          replaces one node in a logic network by constant 0 or 1\n" );
    Abc_Print( -2, "\t-h      : print the command usage\n");
    Abc_Print( -2, "\t<node>  : the node to replace\n");
    Abc_Print( -2, "\t<const> : the constant to replace the node with\n");
    Abc_Print( -2, "\tname    : the node name\n");
    return 1;
}